

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<45UL,_GF2::MOGrlex<45UL>_> * __thiscall
GF2::MP<45UL,_GF2::MOGrlex<45UL>_>::SPoly(MP<45UL,_GF2::MOGrlex<45UL>_> *this,size_t i)

{
  bool bVar1;
  WW<45UL> *this_00;
  size_t in_RSI;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_RDI;
  iterator iter;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_00000040;
  _Self local_20;
  _Self local_18;
  size_t local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::begin
                 (&in_RDI->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::end
                   (&in_RDI->super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    this_00 = &std::_List_iterator<GF2::MM<45UL>_>::operator->
                         ((_List_iterator<GF2::MM<45UL>_> *)0x1e04ae)->super_WW<45UL>;
    WW<45UL>::Set(this_00,local_10,true);
    std::_List_iterator<GF2::MM<45UL>_>::operator++(&local_18);
  }
  Normalize(in_stack_00000040);
  return in_RDI;
}

Assistant:

MP& SPoly(size_t i)
	{
		for (iterator iter = begin(); iter != end(); ++iter)
			iter->Set(i, 1);
		Normalize();
		return *this;
	}